

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

int __thiscall
btSoftBody::rayTest(btSoftBody *this,btVector3 *rayFrom,btVector3 *rayTo,btScalar *mint,_ *feature,
                   int *index,bool bcountonly)

{
  Face *pFVar1;
  Tetra *pTVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  btScalar bVar8;
  btVector3 dir;
  btVector3 v2;
  btVector3 v1;
  RayFromToCaster collider;
  
  dir = operator-(rayTo,rayFrom);
  if ((bcountonly) || ((this->m_fdbvt).m_root == (btDbvtNode *)0x0)) {
    uVar4 = (this->m_faces).m_size;
    uVar5 = 0;
    uVar7 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar7 = uVar5;
    }
    lVar3 = 0x20;
    uVar4 = 0;
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      pFVar1 = (this->m_faces).m_data;
      bVar8 = RayFromToCaster::rayFromToTriangle
                        (rayFrom,rayTo,&dir,
                         (btVector3 *)(*(long *)((long)pFVar1->m_n + lVar3 + -0x20) + 0x10),
                         (btVector3 *)(*(long *)((long)pFVar1->m_n + lVar3 + -0x18) + 0x10),
                         (btVector3 *)(*(long *)((long)pFVar1->m_n + lVar3 + -0x10) + 0x10),*mint);
      if ((0.0 < bVar8) && (uVar4 = uVar4 + 1, !bcountonly)) {
        *feature = Face;
        *index = (int)uVar5;
        *mint = bVar8;
      }
      lVar3 = lVar3 + 0x48;
    }
  }
  else {
    bVar8 = *mint;
    collider.super_ICollide._vptr_ICollide = (_func_int **)&PTR__ICollide_001f2358;
    collider.m_rayFrom.m_floats._0_8_ = *(undefined8 *)rayFrom->m_floats;
    collider.m_rayFrom.m_floats._8_8_ = *(undefined8 *)(rayFrom->m_floats + 2);
    collider.m_rayNormalizedDirection = operator-(rayTo,rayFrom);
    collider.m_rayTo.m_floats._0_8_ = *(undefined8 *)rayTo->m_floats;
    collider.m_rayTo.m_floats._8_8_ = *(undefined8 *)(rayTo->m_floats + 2);
    collider.m_face = (Face *)0x0;
    collider.m_tests = 0;
    collider.m_mint = bVar8;
    btDbvt::rayTest((this->m_fdbvt).m_root,rayFrom,rayTo,&collider.super_ICollide);
    if (collider.m_face != (Face *)0x0) {
      *mint = collider.m_mint;
      *feature = Face;
      *index = (int)(((long)collider.m_face - (long)(this->m_faces).m_data) / 0x48);
    }
    uVar4 = (uint)(collider.m_face != (Face *)0x0);
  }
  for (lVar3 = 0; lVar3 < (this->m_tetras).m_size; lVar3 = lVar3 + 1) {
    pTVar2 = (this->m_tetras).m_data;
    for (lVar6 = 8; lVar6 != 0x38; lVar6 = lVar6 + 0xc) {
      collider.super_ICollide._vptr_ICollide =
           *(_func_int ***)(pTVar2[lVar3].m_n[*(int *)(&UNK_001b3418 + lVar6)]->m_x).m_floats;
      collider.m_rayFrom.m_floats._0_8_ =
           *(undefined8 *)((pTVar2[lVar3].m_n[*(int *)(&UNK_001b3418 + lVar6)]->m_x).m_floats + 2);
      v1.m_floats._0_8_ =
           *(undefined8 *)(pTVar2[lVar3].m_n[*(int *)(&UNK_001b341c + lVar6)]->m_x).m_floats;
      v1.m_floats._8_8_ =
           *(undefined8 *)((pTVar2[lVar3].m_n[*(int *)(&UNK_001b341c + lVar6)]->m_x).m_floats + 2);
      v2.m_floats._0_8_ =
           *(undefined8 *)(pTVar2[lVar3].m_n[*(int *)((long)&DAT_001b3420 + lVar6)]->m_x).m_floats;
      v2.m_floats._8_8_ =
           *(undefined8 *)
            ((pTVar2[lVar3].m_n[*(int *)((long)&DAT_001b3420 + lVar6)]->m_x).m_floats + 2);
      bVar8 = RayFromToCaster::rayFromToTriangle
                        (rayFrom,rayTo,&dir,(btVector3 *)&collider,&v1,&v2,*mint);
      if ((0.0 < bVar8) && (uVar4 = uVar4 + 1, !bcountonly)) {
        *feature = Tetra;
        *index = (int)lVar3;
        *mint = bVar8;
      }
    }
  }
  return uVar4;
}

Assistant:

int					btSoftBody::rayTest(const btVector3& rayFrom,const btVector3& rayTo,
										btScalar& mint,eFeature::_& feature,int& index,bool bcountonly) const
{
	int	cnt=0;
	btVector3 dir = rayTo-rayFrom;
	

	if(bcountonly||m_fdbvt.empty())
	{/* Full search	*/ 
		
		for(int i=0,ni=m_faces.size();i<ni;++i)
		{
			const btSoftBody::Face&	f=m_faces[i];

			const btScalar			t=RayFromToCaster::rayFromToTriangle(	rayFrom,rayTo,dir,
				f.m_n[0]->m_x,
				f.m_n[1]->m_x,
				f.m_n[2]->m_x,
				mint);
			if(t>0)
			{
				++cnt;
				if(!bcountonly)
				{
					feature=btSoftBody::eFeature::Face;
					index=i;
					mint=t;
				}
			}
		}
	}
	else
	{/* Use dbvt	*/ 
		RayFromToCaster	collider(rayFrom,rayTo,mint);

		btDbvt::rayTest(m_fdbvt.m_root,rayFrom,rayTo,collider);
		if(collider.m_face)
		{
			mint=collider.m_mint;
			feature=btSoftBody::eFeature::Face;
			index=(int)(collider.m_face-&m_faces[0]);
			cnt=1;
		}
	}

	for (int i=0;i<m_tetras.size();i++)
	{
		const btSoftBody::Tetra& tet = m_tetras[i];
		int tetfaces[4][3] = {{0,1,2},{0,1,3},{1,2,3},{0,2,3}};
		for (int f=0;f<4;f++)
		{

			int index0=tetfaces[f][0];
			int index1=tetfaces[f][1];
			int index2=tetfaces[f][2];
			btVector3 v0=tet.m_n[index0]->m_x;
			btVector3 v1=tet.m_n[index1]->m_x;
			btVector3 v2=tet.m_n[index2]->m_x;


		const btScalar			t=RayFromToCaster::rayFromToTriangle(	rayFrom,rayTo,dir,
			v0,v1,v2,
				mint);
		if(t>0)
			{
				++cnt;
				if(!bcountonly)
				{
					feature=btSoftBody::eFeature::Tetra;
					index=i;
					mint=t;
				}
			}
		}
	}
	return(cnt);
}